

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::java::NestedInFileClass(EnumDescriptor *descriptor,bool immutable)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  Status *local_70;
  LogMessage local_50;
  Voidify local_3d [13];
  Status local_30;
  undefined1 local_28 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  bool immutable_local;
  EnumDescriptor *descriptor_local;
  
  absl_log_internal_check_ok_goo.second._7_1_ = immutable;
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_28);
  ValidateNestInFileClassFeature((java *)&local_30,descriptor);
  local_28 = (undefined1  [8])absl::lts_20250127::log_internal::AsStatus(&local_30);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_28);
  if (bVar1) {
    local_70 = (Status *)0x0;
  }
  else {
    local_70 = (Status *)
               absl::lts_20250127::status_internal::MakeCheckFailString
                         ((Nonnull<const_absl::Status_*>)local_28,
                          "ValidateNestInFileClassFeature(descriptor) is OK");
  }
  absl_log_internal_check_ok_goo.first = local_70;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_28);
  absl::lts_20250127::Status::~Status(&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = anon_unknown_36::NestInFileClass<google::protobuf::EnumDescriptor>
                      (descriptor,(bool)(absl_log_internal_check_ok_goo.second._7_1_ & 1));
    return bVar1;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                          ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
             ,0x3da,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_3d,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

bool NestedInFileClass(const EnumDescriptor& descriptor, bool immutable) {
  ABSL_CHECK_OK(ValidateNestInFileClassFeature(descriptor));
  return NestInFileClass(descriptor, immutable);
}